

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bucketaccum.hpp
# Opt level: O2

QuadTerms * __thiscall
mp::BucketAccum1Type<mp::QuadTerms>::ExtractBucket
          (QuadTerms *__return_storage_ptr__,BucketAccum1Type<mp::QuadTerms> *this,size_t i)

{
  reference pvVar1;
  
  pvVar1 = std::array<mp::QuadTerms,_64UL>::at(&this->buckets_,i);
  QuadTerms::QuadTerms(__return_storage_ptr__,pvVar1);
  (this->buckets_)._M_elems[i].folded_.
  super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
  super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_size = 0;
  (this->buckets_)._M_elems[i].coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data
  .super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
  (this->buckets_)._M_elems[i].vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
  (this->buckets_)._M_elems[i].vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
  return __return_storage_ptr__;
}

Assistant:

Body BucketAccum1Type<Body>::ExtractBucket(size_t i) {
  Body result = std::move(buckets_.at(i));
  buckets_[i].clear();            // std::move does not
  return result;
}